

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  ulong uVar1;
  wchar_t wVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  wchar_t *pwVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  wchar_t *pwVar11;
  long lVar12;
  
  uVar4 = this->abs_value;
  pwVar11 = *it + this->size;
  pwVar7 = pwVar11;
  if (uVar4 < 100) {
    if (9 < uVar4) {
      uVar4 = (ulong)(uint)((int)uVar4 * 2);
      pwVar7 = pwVar11 + -1;
      pwVar11[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar4 + 1];
      goto LAB_0012a295;
    }
  }
  else {
    iVar8 = -1;
    uVar10 = 1;
    iVar5 = -2;
    uVar6 = 2;
    do {
      uVar3 = uVar4;
      uVar4 = uVar3 / 100;
      uVar1 = (ulong)(uint)(((int)uVar3 + (int)uVar4 * -100) * 2);
      pwVar7[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar1 + 1];
      lVar12 = -4;
      if ((int)(uVar10 / 3) * 3 + iVar8 == 0) {
        pwVar7[-2] = this->sep;
        lVar12 = -8;
      }
      *(int *)((long)pwVar7 + lVar12 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar1];
      if ((int)(uVar6 / 3) * 3 + iVar5 == 0) {
        *(char_type *)((long)pwVar7 + lVar12 + -8) = this->sep;
        lVar12 = lVar12 + -8;
      }
      else {
        lVar12 = lVar12 + -4;
      }
      pwVar7 = (wchar_t *)((long)pwVar7 + lVar12);
      iVar8 = iVar8 + -2;
      uVar9 = (int)uVar10 + 2;
      uVar10 = (ulong)uVar9;
      iVar5 = iVar5 + -2;
      uVar6 = (ulong)((int)uVar6 + 2);
    } while (9999 < uVar3);
    if (999 < uVar3) {
      uVar4 = (ulong)(uint)((int)uVar4 * 2);
      pwVar7[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar4 + 1];
      if (iVar8 + (uVar9 / 3) * 3 == 0) {
        pwVar7[-2] = this->sep;
        pwVar7 = pwVar7 + -2;
      }
      else {
        pwVar7 = pwVar7 + -1;
      }
LAB_0012a295:
      wVar2 = (wchar_t)(char)internal::basic_data<void>::DIGITS[uVar4];
      goto LAB_0012a2a2;
    }
  }
  wVar2 = (uint)uVar4 | 0x30;
LAB_0012a2a2:
  pwVar7[-1] = wVar2;
  *it = pwVar11;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }